

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

btVector3 __thiscall
btRigidBody::computeGyroscopicForceExplicit(btRigidBody *this,btScalar maxGyroscopicForce)

{
  btTransform *pbVar1;
  btRigidBody *in_RDI;
  float in_XMM0_Da;
  btScalar bVar2;
  btVector3 bVar3;
  btScalar l2;
  btVector3 tmp;
  btMatrix3x3 inertiaTensorWorld;
  btVector3 inertiaLocal;
  btVector3 gf;
  btVector3 *v;
  float local_d4;
  btScalar local_d0;
  undefined1 local_cc [12];
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  btMatrix3x3 *in_stack_ffffffffffffff70;
  btVector3 *in_stack_ffffffffffffff88;
  btMatrix3x3 *in_stack_ffffffffffffff90;
  btMatrix3x3 *in_stack_ffffffffffffffa8;
  btMatrix3x3 *in_stack_ffffffffffffffb0;
  btVector3 local_10;
  
  getLocalInertia((btRigidBody *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  pbVar1 = btCollisionObject::getWorldTransform(&in_RDI->super_btCollisionObject);
  btTransform::getBasis(pbVar1);
  btMatrix3x3::scaled(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pbVar1 = btCollisionObject::getWorldTransform(&in_RDI->super_btCollisionObject);
  btTransform::getBasis(pbVar1);
  btMatrix3x3::transpose(in_stack_ffffffffffffff70);
  v = (btVector3 *)&stack0xffffffffffffffa4;
  ::operator*(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  getAngularVelocity(in_RDI);
  bVar3 = ::operator*((btMatrix3x3 *)in_RDI,v);
  local_cc = bVar3.m_floats._0_12_;
  getAngularVelocity(in_RDI);
  local_10 = btVector3::cross((btVector3 *)in_RDI,v);
  local_d0 = btVector3::length2((btVector3 *)0x230e1f);
  if (in_XMM0_Da * in_XMM0_Da < local_d0) {
    bVar2 = btSqrt(0.0);
    local_d4 = (1.0 / bVar2) * in_XMM0_Da;
    btVector3::operator*=(&local_10,&local_d4);
  }
  return (btVector3)local_10.m_floats;
}

Assistant:

btVector3 btRigidBody::computeGyroscopicForceExplicit(btScalar maxGyroscopicForce) const
{
	btVector3 inertiaLocal = getLocalInertia();
	btMatrix3x3 inertiaTensorWorld = getWorldTransform().getBasis().scaled(inertiaLocal) * getWorldTransform().getBasis().transpose();
	btVector3 tmp = inertiaTensorWorld*getAngularVelocity();
	btVector3 gf = getAngularVelocity().cross(tmp);
	btScalar l2 = gf.length2();
	if (l2>maxGyroscopicForce*maxGyroscopicForce)
	{
		gf *= btScalar(1.)/btSqrt(l2)*maxGyroscopicForce;
	}
	return gf;
}